

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::Update(CUI *this,float MouseX,float MouseY,float MouseWorldX,float MouseWorldY)

{
  bool bVar1;
  uint uVar2;
  IInput *pIVar3;
  CLineInput *pCVar4;
  CUI *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  CLineInput *pActiveInput;
  uint MouseButtons;
  uint local_1c;
  
  local_1c = 0;
  bVar1 = Enabled(in_RDI);
  if (bVar1) {
    pIVar3 = Input(in_RDI);
    uVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x19b);
    local_1c = (uint)((uVar2 & 1) != 0);
    pIVar3 = Input(in_RDI);
    uVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x19c);
    if ((uVar2 & 1) != 0) {
      local_1c = local_1c | 2;
    }
    pIVar3 = Input(in_RDI);
    uVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x19d);
    if ((uVar2 & 1) != 0) {
      local_1c = local_1c | 4;
    }
  }
  in_RDI->m_MouseX = in_XMM0_Da;
  in_RDI->m_MouseY = in_XMM1_Da;
  in_RDI->m_MouseWorldX = in_XMM2_Da;
  in_RDI->m_MouseWorldY = in_XMM3_Da;
  in_RDI->m_LastMouseButtons = in_RDI->m_MouseButtons;
  in_RDI->m_MouseButtons = local_1c;
  in_RDI->m_pHotItem = in_RDI->m_pBecommingHotItem;
  if (in_RDI->m_pActiveItem != (void *)0x0) {
    in_RDI->m_pHotItem = in_RDI->m_pActiveItem;
  }
  in_RDI->m_pBecommingHotItem = (void *)0x0;
  bVar1 = Enabled(in_RDI);
  if ((((bVar1) && (pCVar4 = CLineInput::GetActiveInput(), pCVar4 != (CLineInput *)0x0)) &&
      (in_RDI->m_pLastActiveItem != (void *)0x0)) &&
     (pCVar4 != (CLineInput *)in_RDI->m_pLastActiveItem)) {
    CLineInput::Deactivate((CLineInput *)0x1dbbc9);
  }
  return;
}

Assistant:

void CUI::Update(float MouseX, float MouseY, float MouseWorldX, float MouseWorldY)
{
	unsigned MouseButtons = 0;
	if(Enabled())
	{
		if(Input()->KeyIsPressed(KEY_MOUSE_1)) MouseButtons |= 1;
		if(Input()->KeyIsPressed(KEY_MOUSE_2)) MouseButtons |= 2;
		if(Input()->KeyIsPressed(KEY_MOUSE_3)) MouseButtons |= 4;
	}

	m_MouseX = MouseX;
	m_MouseY = MouseY;
	m_MouseWorldX = MouseWorldX;
	m_MouseWorldY = MouseWorldY;
	m_LastMouseButtons = m_MouseButtons;
	m_MouseButtons = MouseButtons;
	m_pHotItem = m_pBecommingHotItem;
	if(m_pActiveItem)
		m_pHotItem = m_pActiveItem;
	m_pBecommingHotItem = 0;

	if(Enabled())
	{
		CLineInput *pActiveInput = CLineInput::GetActiveInput();
		if(pActiveInput && m_pLastActiveItem && pActiveInput != m_pLastActiveItem)
			pActiveInput->Deactivate();
	}
}